

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

void TestConstExpr::ComparisonTestT<unsigned_long>(void)

{
  ComparisonTestTU<unsigned_long,char>();
  ComparisonTestTU<unsigned_long,signed_char>();
  ComparisonTestTU<unsigned_long,unsigned_char>();
  ComparisonTestTU<unsigned_long,short>();
  ComparisonTestTU<unsigned_long,unsigned_short>();
  ComparisonTestTU<unsigned_long,int>();
  ComparisonTestTU<unsigned_long,unsigned_int>();
  ComparisonTestTU<unsigned_long,long>();
  ComparisonTestTU<unsigned_long,unsigned_long>();
  ComparisonTestTU<unsigned_long,long_long>();
  ComparisonTestTU<unsigned_long,unsigned_long_long>();
  return;
}

Assistant:

void ComparisonTestT()
	{
		ComparisonTestTU<T, char>();
		ComparisonTestTU<T, signed char>();
		ComparisonTestTU<T, unsigned char>();
		ComparisonTestTU<T, signed short>();
		ComparisonTestTU<T, unsigned short>();
		ComparisonTestTU<T, signed int>();
		ComparisonTestTU<T, unsigned int>();
		ComparisonTestTU<T, signed long>();
		ComparisonTestTU<T, unsigned long>();
		ComparisonTestTU<T, signed long long>();
		ComparisonTestTU<T, unsigned long long>();
	}